

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

LispPTR reclaimstackp(LispPTR ptr)

{
  LispPTR *pLVar1;
  FX *frame68k;
  FX *fxp;
  STACKP *stkp;
  LispPTR ptr_local;
  
  pLVar1 = NativeAligned4FromLAddr(ptr);
  frame68k = (FX *)NativeAligned4FromStackOffset((DLword)*pLVar1);
  decusecount68k(frame68k);
  return 0;
}

Assistant:

LispPTR reclaimstackp(LispPTR ptr) /* This is the entry function */
                                   /*  in stack reclaiming */
{
  STACKP *stkp;
  FX *fxp;
  stkp = (STACKP *)NativeAligned4FromLAddr(ptr);
  fxp = (FX *)NativeAligned4FromStackOffset(stkp->edfxp);
  decusecount68k(fxp); /* decrement the use-count for the frame it uses */
  return (NIL);        /* and let the normal reclaimer reclaim it */
}